

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O1

bool __thiscall
draco::AttributeOctahedronTransform::InverseTransformAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  undefined8 uVar1;
  ValueType VVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  DataBuffer *extraout_RAX;
  long lVar8;
  undefined8 *puVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  DataBuffer *pDVar7;
  
  if (((target_attribute->super_GeometryAttribute).data_type_ == DT_FLOAT32) &&
     ((target_attribute->super_GeometryAttribute).num_components_ == '\x03')) {
    VVar2 = target_attribute->num_unique_entries_;
    bVar10 = this->quantization_bits_ - 2U < 0x1d;
    if (VVar2 != 0 && bVar10) {
      fVar14 = 2.0 / (float)((1 << ((byte)this->quantization_bits_ & 0x1f)) + -2);
      puVar9 = (undefined8 *)
               ((long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start +
               (target_attribute->super_GeometryAttribute).byte_offset_);
      pDVar7 = (attribute->super_GeometryAttribute).buffer_;
      lVar3 = (long)(pDVar7->data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      lVar4 = (attribute->super_GeometryAttribute).byte_offset_;
      lVar8 = 0;
      do {
        uVar1 = *(undefined8 *)(lVar3 + lVar4 + lVar8 * 8);
        fVar15 = (float)(int)uVar1 * fVar14 + -1.0;
        fVar16 = (float)(int)((ulong)uVar1 >> 0x20) * fVar14 + -1.0;
        fVar17 = (1.0 - ABS(fVar15)) - ABS(fVar16);
        fVar11 = 0.0;
        if (0.0 <= -fVar17) {
          fVar11 = -fVar17;
        }
        fVar12 = 0.0;
        fVar13 = 0.0;
        auVar5._4_4_ = -(uint)(fVar15 < 0.0);
        auVar5._0_4_ = -(uint)(fVar15 < 0.0);
        auVar5._8_4_ = -(uint)(fVar16 < 0.0);
        auVar5._12_4_ = -(uint)(fVar16 < 0.0);
        uVar6 = movmskpd((int)pDVar7,auVar5);
        pDVar7 = (DataBuffer *)(ulong)uVar6;
        fVar18 = fVar11;
        if ((uVar6 & 1) == 0) {
          fVar18 = -fVar11;
        }
        if ((uVar6 & 2) == 0) {
          fVar11 = -fVar11;
        }
        fVar15 = fVar15 + fVar18;
        fVar16 = fVar16 + fVar11;
        fVar11 = fVar16 * fVar16 + fVar17 * fVar17 + fVar15 * fVar15;
        fVar18 = 0.0;
        if (1e-06 <= fVar11) {
          if (fVar11 < 0.0) {
            fVar11 = sqrtf(fVar11);
            pDVar7 = extraout_RAX;
          }
          else {
            fVar11 = SQRT(fVar11);
          }
          fVar11 = 1.0 / fVar11;
          fVar18 = fVar16 * fVar11;
          fVar12 = fVar11 * fVar17;
          fVar13 = fVar11 * fVar15;
        }
        *puVar9 = CONCAT44(fVar13,fVar12);
        *(float *)(puVar9 + 1) = fVar18;
        puVar9 = (undefined8 *)((long)puVar9 + 0xc);
        lVar8 = lVar8 + 1;
      } while (VVar2 != (ValueType)lVar8);
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool AttributeOctahedronTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  const int num_points = target_attribute->size();
  const int num_components = target_attribute->num_components();
  if (num_components != 3) {
    return false;
  }
  constexpr int kEntrySize = sizeof(float) * 3;
  float att_val[3];
  const int32_t *source_attribute_data = reinterpret_cast<const int32_t *>(
      attribute.GetAddress(AttributeValueIndex(0)));
  uint8_t *target_address =
      target_attribute->GetAddress(AttributeValueIndex(0));
  OctahedronToolBox octahedron_tool_box;
  if (!octahedron_tool_box.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  for (uint32_t i = 0; i < num_points; ++i) {
    const int32_t s = *source_attribute_data++;
    const int32_t t = *source_attribute_data++;
    octahedron_tool_box.QuantizedOctahedralCoordsToUnitVector(s, t, att_val);

    // Store the decoded floating point values into the attribute buffer.
    std::memcpy(target_address, att_val, kEntrySize);
    target_address += kEntrySize;
  }
  return true;
}